

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
mjs::function_base::function_base
          (function_base *this,source_extend *body_extend,wstring *id,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *params,statement_ptr *block)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  block_statement *__p;
  bool bVar4;
  statement_ptr *block_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *params_local;
  wstring *id_local;
  source_extend *body_extend_local;
  function_base *this_local;
  
  source_extend::source_extend(&this->body_extend_,body_extend);
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&this->params_,params);
  std::shared_ptr<mjs::block_statement>::shared_ptr(&this->block_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)block);
  bVar4 = false;
  if (bVar1) {
    psVar3 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       (block);
    iVar2 = (*(psVar3->super_syntax_node)._vptr_syntax_node[3])();
    bVar4 = iVar2 == 0;
  }
  if (bVar4) {
    __p = (block_statement *)
          std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::release(block);
    std::__shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>::reset<mjs::block_statement>
              (&(this->block_).super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>,
               __p);
    return;
  }
  __assert_fail("block && block->type() == statement_type::block",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x81,
                "mjs::function_base::function_base(const source_extend &, const std::wstring &, std::vector<std::wstring> &&, statement_ptr &&)"
               );
}

Assistant:

function_base::function_base(const source_extend& body_extend, const std::wstring& id, std::vector<std::wstring>&& params, statement_ptr&& block) : body_extend_(body_extend), id_(id), params_(std::move(params)) {
    assert(block && block->type() == statement_type::block);
    block_.reset(static_cast<block_statement*>(block.release()));
}